

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderBuiltinConstantTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::ShaderBuiltinConstantCase<tcu::Vector<int,_3>_>::
~ShaderBuiltinConstantCase(ShaderBuiltinConstantCase<tcu::Vector<int,_3>_> *this)

{
  ShaderBuiltinConstantCase<tcu::Vector<int,_3>_> *this_local;
  
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderBuiltinConstantCase_011cfdb8;
  std::__cxx11::string::~string((string *)&this->m_requiredExt);
  std::__cxx11::string::~string((string *)&this->m_varName);
  TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

ShaderBuiltinConstantCase<DataType>::~ShaderBuiltinConstantCase (void)
{
}